

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O1

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadAnimation(OgreBinarySerializer *this,Animation *anim)

{
  StreamReader<false,_false> *pSVar1;
  undefined1 *puVar2;
  unsigned_short uVar3;
  unsigned_short uVar4;
  uint uVar5;
  MemoryStreamReader *this_00;
  bool bVar6;
  float fVar7;
  VertexAnimationTrack track;
  undefined1 local_a0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  vector<Assimp::Ogre::PoseKeyFrame,_std::allocator<Assimp::Ogre::PoseKeyFrame>_> local_78;
  vector<Assimp::Ogre::MorphKeyFrame,_std::allocator<Assimp::Ogre::MorphKeyFrame>_> local_60;
  pointer local_48;
  pointer local_38;
  
  pSVar1 = this->m_reader;
  if (*(int *)&pSVar1->end != *(int *)&pSVar1->current) {
    uVar3 = StreamReader<false,_false>::Get<unsigned_short>(pSVar1);
    uVar5 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
    this->m_currentLen = uVar5;
    if (uVar3 == 0xd105) {
      ReadLine_abi_cxx11_((string *)local_a0,this);
      std::__cxx11::string::operator=((string *)&anim->baseName,(string *)local_a0);
      puVar2 = (undefined1 *)CONCAT26(local_a0._6_2_,CONCAT24(local_a0._4_2_,local_a0._0_4_));
      if (puVar2 != local_a0 + 0x10) {
        operator_delete(puVar2,local_a0._16_8_ + 1);
      }
      fVar7 = StreamReader<false,_false>::Get<float>(this->m_reader);
      anim->baseTime = fVar7;
      uVar3 = StreamReader<false,_false>::Get<unsigned_short>(this->m_reader);
      uVar5 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
      this->m_currentLen = uVar5;
    }
    this_00 = this->m_reader;
    bVar6 = *(int *)&this_00->end == *(int *)&this_00->current;
    if (uVar3 == 0xd110 && !bVar6) {
      do {
        VertexAnimationTrack::VertexAnimationTrack((VertexAnimationTrack *)local_a0);
        uVar4 = StreamReader<false,_false>::Get<unsigned_short>(this->m_reader);
        local_a0._0_4_ = ZEXT24(uVar4);
        local_a0._4_2_ = StreamReader<false,_false>::Get<unsigned_short>(this->m_reader);
        ReadAnimationKeyFrames(this,anim,(VertexAnimationTrack *)local_a0);
        std::
        vector<Assimp::Ogre::VertexAnimationTrack,_std::allocator<Assimp::Ogre::VertexAnimationTrack>_>
        ::push_back(&anim->tracks,(VertexAnimationTrack *)local_a0);
        pSVar1 = this->m_reader;
        if (*(int *)&pSVar1->end != *(int *)&pSVar1->current) {
          uVar3 = StreamReader<false,_false>::Get<unsigned_short>(pSVar1);
          uVar5 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
          this->m_currentLen = uVar5;
        }
        if (local_48 != (pointer)0x0) {
          operator_delete(local_48,(long)local_38 - (long)local_48);
        }
        std::vector<Assimp::Ogre::MorphKeyFrame,_std::allocator<Assimp::Ogre::MorphKeyFrame>_>::
        ~vector(&local_60);
        std::vector<Assimp::Ogre::PoseKeyFrame,_std::allocator<Assimp::Ogre::PoseKeyFrame>_>::
        ~vector(&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._8_8_ != &local_88) {
          operator_delete((void *)local_a0._8_8_,local_88._0_8_ + 1);
        }
        this_00 = this->m_reader;
        bVar6 = *(int *)&this_00->end == *(int *)&this_00->current;
      } while ((!bVar6) && (uVar3 == 0xd110));
    }
    if (!bVar6) {
      StreamReader<false,_false>::IncPtr(this_00,-6);
    }
  }
  return;
}

Assistant:

void OgreBinarySerializer::ReadAnimation(Animation *anim)
{
    if (!AtEnd())
    {
        uint16_t id = ReadHeader();
        if (id == M_ANIMATION_BASEINFO)
        {
            anim->baseName = ReadLine();
            anim->baseTime = Read<float>();

            // Advance to first track
            id = ReadHeader();
        }

        while (!AtEnd() && id == M_ANIMATION_TRACK)
        {
            VertexAnimationTrack track;
            track.type = static_cast<VertexAnimationTrack::Type>(Read<uint16_t>());
            track.target = Read<uint16_t>();

            ReadAnimationKeyFrames(anim, &track);

            anim->tracks.push_back(track);

            if (!AtEnd())
                id = ReadHeader();
        }
        if (!AtEnd())
            RollbackHeader();
    }
}